

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddhcal.cpp
# Opt level: O2

int __thiscall
icu_63::BuddhistCalendar::clone
          (BuddhistCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BuddhistCalendar *this_00;
  
  this_00 = (BuddhistCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 != (BuddhistCalendar *)0x0) {
    BuddhistCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* BuddhistCalendar::clone(void) const
{
    return new BuddhistCalendar(*this);
}